

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_source.c
# Opt level: O0

CamSource *
camera_source_init(char *device,RK_U32 bufcnt,RK_U32 width,RK_U32 height,MppFrameFormat format)

{
  int iVar1;
  RK_S32 RVar2;
  void *pvVar3;
  undefined1 local_500 [4];
  RK_S32 idx;
  undefined1 local_4a8 [8];
  v4l2_plane planes_1 [1];
  undefined4 local_460 [2];
  MppBufferInfo info;
  v4l2_exportbuffer expbuf;
  v4l2_plane planes [1];
  undefined1 local_35c [12];
  __u32 _Stack_350;
  __u32 local_34c;
  int local_348;
  __u32 local_344;
  v4l2_fmtdesc fmtdesc;
  int local_238;
  undefined1 auStack_234 [4];
  v4l2_input input;
  CamSource *ctx;
  uint local_1d8;
  RK_U32 buf_len;
  RK_U32 i;
  v4l2_buf_type type;
  v4l2_buffer buf;
  RK_U32 RStack_170;
  v4l2_requestbuffers req;
  v4l2_format vfmt;
  v4l2_capability cap;
  MppFrameFormat format_local;
  RK_U32 height_local;
  RK_U32 width_local;
  RK_U32 bufcnt_local;
  char *device_local;
  
  input._72_8_ = mpp_osal_calloc("camera_source_init",0x150);
  if (input._72_8_ != 0) {
    *(RK_U32 *)(input._72_8_ + 4) = bufcnt;
    iVar1 = open(device,0x80002,0);
    *(int *)input._72_8_ = iVar1;
    if (*(int *)input._72_8_ < 0) {
      _mpp_log_l(2,"camera_source","Cannot open device\n","camera_source_init");
    }
    else {
      local_238 = 0;
      while (RVar2 = camera_source_ioctl(*(RK_S32 *)input._72_8_,-0x3fafa9e6,&local_238), RVar2 == 0
            ) {
        _mpp_log_l(4,"camera_source","input devices:%s\n",0,auStack_234);
        local_238 = local_238 + 1;
      }
      RVar2 = camera_source_ioctl(*(RK_S32 *)input._72_8_,-0x7f97aa00,
                                  (void *)((long)&vfmt.fmt + 0xc0));
      if (RVar2 == 0) {
        if (((cap.bus_info._28_4_ & 1) == 0) && ((cap.bus_info._28_4_ & 0x1000) == 0)) {
          _mpp_log_l(2,"camera_source","Capture not supported\n","camera_source_init");
        }
        else if ((cap.bus_info._28_4_ & 0x4000000) == 0) {
          _mpp_log_l(2,"camera_source","Streaming IO Not Supported\n","camera_source_init");
        }
        else {
          memset(fmtdesc.reserved + 1,0,0xd0);
          memcpy(&req.capabilities,fmtdesc.reserved + 1,0xd0);
          req.capabilities = 1;
          if ((cap.bus_info._28_4_ & 0x1000) != 0) {
            req.capabilities = 9;
          }
          local_348 = 0;
          local_344 = req.capabilities;
          vfmt.type = width;
          vfmt._4_4_ = height;
          while( true ) {
            RVar2 = camera_source_ioctl(*(RK_S32 *)input._72_8_,-0x3fbfa9fe,&local_348);
            if (RVar2 != 0) break;
            _mpp_log_l(4,"camera_source","fmt name: [%s]\n",0,&fmtdesc.type);
            _mpp_log_l(4,"camera_source","fmt pixelformat: \'%c%c%c%c\', description = \'%s\'\n",0,
                       fmtdesc.description._24_4_ & 0xff,
                       (uint)fmtdesc.description._24_4_ >> 8 & 0xff,
                       (uint)fmtdesc.description._24_4_ >> 0x10 & 0xff,
                       (uint)fmtdesc.description._24_4_ >> 0x18,&fmtdesc.type);
            local_348 = local_348 + 1;
          }
          if (((format & 0xf0000) == MPP_FMT_YUV420SP) && ((format & 0xfffff) < MPP_FMT_YUV_BUTT)) {
            vfmt.fmt.pix.width = V4L2_yuv_cfg[format];
          }
          else if (((format & 0xf0000) == MPP_FMT_RGB565) && ((format & 0xfffff) < MPP_FMT_RGB_BUTT)
                  ) {
            vfmt.fmt.pix.width = V4L2_RGB_cfg[format - MPP_FMT_RGB565];
          }
          if (vfmt.fmt.pix.width == 0) {
            vfmt.fmt.pix.width = 0x3231564e;
          }
          buf_len = req.capabilities;
          *(__u32 *)(input._72_8_ + 8) = req.capabilities;
          RVar2 = camera_source_ioctl(*(RK_S32 *)input._72_8_,-0x3f2fa9fb,&req.capabilities);
          if (RVar2 == -1) {
            _mpp_log_l(2,"camera_source","VIDIOC_S_FMT\n","camera_source_init");
          }
          else {
            RVar2 = camera_source_ioctl(*(RK_S32 *)input._72_8_,-0x3f2fa9fc,&req.capabilities);
            if (RVar2 == -1) {
              _mpp_log_l(2,"camera_source","VIDIOC_G_FMT\n","camera_source_init");
            }
            else {
              _mpp_log_l(4,"camera_source","get width %d height %d",0,vfmt.type,vfmt._4_4_);
              memset(local_35c,0,0x14);
              req.memory = local_34c;
              stack0xfffffffffffffe8c = CONCAT44(buf_len,*(undefined4 *)(input._72_8_ + 4));
              req.type = _Stack_350;
              req.count = 1;
              RVar2 = camera_source_ioctl(*(RK_S32 *)input._72_8_,-0x3feba9f8,&buf.field_0x54);
              if (RVar2 == -1) {
                _mpp_log_l(2,"camera_source","Device does not support mmap\n","camera_source_init");
              }
              else if (buf._84_4_ == *(int *)(input._72_8_ + 4)) {
                for (local_1d8 = 0; local_1d8 < *(uint *)(input._72_8_ + 4);
                    local_1d8 = local_1d8 + 1) {
                  memset(planes[0].reserved + 9,0,0x58);
                  memcpy(&i,planes[0].reserved + 9,0x58);
                  type = buf_len;
                  i = local_1d8;
                  buf.timecode.userbits[0] = '\x01';
                  buf.timecode.userbits[1] = '\0';
                  buf.timecode.userbits[2] = '\0';
                  buf.timecode.userbits[3] = '\0';
                  if (buf_len == 9) {
                    buf._56_8_ = expbuf.reserved + 9;
                    buf.m.offset = 1;
                  }
                  RVar2 = camera_source_ioctl(*(RK_S32 *)input._72_8_,-0x3fa7a9f7,&i);
                  if (RVar2 == -1) {
                    _mpp_log_l(2,"camera_source","ERROR: VIDIOC_QUERYBUF\n","camera_source_init");
                    goto LAB_0011701d;
                  }
                  if (type == V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE) {
                    ctx._4_4_ = *(uint *)(buf._56_8_ + 4);
                    pvVar3 = mmap((void *)0x0,(ulong)*(uint *)(buf._56_8_ + 4),3,1,
                                  *(int *)input._72_8_,(ulong)*(uint *)(buf._56_8_ + 8));
                    *(void **)(input._72_8_ + 0x10 + (ulong)local_1d8 * 0x20) = pvVar3;
                  }
                  else {
                    ctx._4_4_ = buf.m.offset;
                    pvVar3 = mmap((void *)0x0,(ulong)buf.m.offset,3,1,*(int *)input._72_8_,
                                  buf._56_8_ & 0xffffffff);
                    *(void **)(input._72_8_ + 0x10 + (ulong)local_1d8 * 0x20) = pvVar3;
                  }
                  if (*(long *)(input._72_8_ + 0x10 + (ulong)local_1d8 * 0x20) == -1) {
                    _mpp_log_l(2,"camera_source","ERROR: Failed to map device frame buffers\n",
                               "camera_source_init");
                    goto LAB_0011701d;
                  }
                  *(ulong *)(input._72_8_ + (ulong)local_1d8 * 0x20 + 0x18) = (ulong)ctx._4_4_;
                  memset(&info.fd,0,0x40);
                  info.fd = buf_len;
                  info.index = local_1d8;
                  expbuf.index = 0x80000;
                  RVar2 = camera_source_ioctl(*(RK_S32 *)input._72_8_,-0x3fbfa9f0,&info.fd);
                  if (RVar2 < 0) {
                    _mpp_log_l(2,"camera_source","get dma buf failed\n","camera_source_init");
                    goto LAB_0011701d;
                  }
                  _mpp_log_l(4,"camera_source","get dma buf(%d)-fd: %d\n",0,local_1d8,expbuf.plane);
                  memset(local_460,0,0x28);
                  local_460[0] = 2;
                  info.hnd._0_4_ = expbuf.plane;
                  info._0_8_ = ZEXT48(ctx._4_4_ & 0x7ffffff);
                  info.hnd._4_4_ = ctx._4_4_ >> 0x1b;
                  mpp_buffer_import_with_tag
                            (0,local_460,input._72_8_ + (ulong)local_1d8 * 0x20 + 0x28,
                             "camera_source","camera_source_init");
                  *(__u32 *)(input._72_8_ + (ulong)local_1d8 * 0x20 + 0x20) = expbuf.plane;
                }
                for (local_1d8 = 0; local_1d8 < *(uint *)(input._72_8_ + 4);
                    local_1d8 = local_1d8 + 1) {
                  memset(local_500,0,0x58);
                  memcpy(&i,local_500,0x58);
                  type = buf_len;
                  i = local_1d8;
                  buf.timecode.userbits[0] = '\x01';
                  buf.timecode.userbits[1] = '\0';
                  buf.timecode.userbits[2] = '\0';
                  buf.timecode.userbits[3] = '\0';
                  if (buf_len == 9) {
                    buf._56_8_ = local_4a8;
                    buf.m.offset = 1;
                  }
                  RVar2 = camera_source_ioctl(*(RK_S32 *)input._72_8_,-0x3fa7a9f1,&i);
                  if (RVar2 == -1) {
                    _mpp_log_l(2,"camera_source","ERROR: VIDIOC_QBUF %d\n","camera_source_init",
                               local_1d8);
                    goto LAB_0011701d;
                  }
                }
                RVar2 = camera_source_ioctl(*(RK_S32 *)input._72_8_,0x40045612,&buf_len);
                if (RVar2 != -1) {
                  for (local_1d8 = 0; local_1d8 < *(uint *)(input._72_8_ + 4);
                      local_1d8 = local_1d8 + 1) {
                    RVar2 = camera_source_get_frame((CamSource *)input._72_8_);
                    if (-1 < RVar2) {
                      camera_source_put_frame((CamSource *)input._72_8_,RVar2);
                    }
                  }
                  return (CamSource *)input._72_8_;
                }
                _mpp_log_l(2,"camera_source","ERROR: VIDIOC_STREAMON\n","camera_source_init");
              }
              else {
                _mpp_log_l(2,"camera_source","Device buffer count mismatch\n","camera_source_init");
              }
            }
          }
        }
      }
      else {
        _mpp_log_l(2,"camera_source","Not v4l2 compatible\n","camera_source_init");
      }
    }
LAB_0011701d:
    camera_source_deinit((CamSource *)input._72_8_);
  }
  return (CamSource *)0x0;
}

Assistant:

CamSource *camera_source_init(const char *device, RK_U32 bufcnt, RK_U32 width, RK_U32 height, MppFrameFormat format)
{
    struct v4l2_capability     cap;
    struct v4l2_format         vfmt;
    struct v4l2_requestbuffers req;
    struct v4l2_buffer         buf;
    enum   v4l2_buf_type       type;
    RK_U32 i;
    RK_U32 buf_len = 0;
    CamSource *ctx;

    ctx = mpp_calloc(CamSource, 1);
    if (!ctx)
        return NULL;

    ctx->bufcnt = bufcnt;
    ctx->fd = open(device, O_RDWR | O_CLOEXEC, 0);
    if (ctx->fd < 0) {
        mpp_err_f("Cannot open device\n");
        goto FAIL;
    }

    {
        struct v4l2_input input;

        input.index = 0;
        while (!camera_source_ioctl(ctx->fd, VIDIOC_ENUMINPUT, &input)) {
            mpp_log("input devices:%s\n", input.name);
            ++input.index;
        }
    }

    // Determine if fd is a V4L2 Device
    if (0 != camera_source_ioctl(ctx->fd, VIDIOC_QUERYCAP, &cap)) {
        mpp_err_f("Not v4l2 compatible\n");
        goto FAIL;
    }

    if (!(cap.capabilities & V4L2_CAP_VIDEO_CAPTURE) && !(cap.capabilities & V4L2_CAP_VIDEO_CAPTURE_MPLANE)) {
        mpp_err_f("Capture not supported\n");
        goto FAIL;
    }

    if (!(cap.capabilities & V4L2_CAP_STREAMING)) {
        mpp_err_f("Streaming IO Not Supported\n");
        goto FAIL;
    }

    // Preserve original settings as set by v4l2-ctl for example
    vfmt = (struct v4l2_format) {0};
    vfmt.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;

    if (cap.capabilities & V4L2_CAP_VIDEO_CAPTURE_MPLANE)
        vfmt.type = V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE;

    vfmt.fmt.pix.width = width;
    vfmt.fmt.pix.height = height;

    {
        struct v4l2_fmtdesc fmtdesc;

        fmtdesc.index = 0;
        fmtdesc.type = vfmt.type;
        while (!camera_source_ioctl(ctx->fd, VIDIOC_ENUM_FMT, &fmtdesc)) {
            mpp_log("fmt name: [%s]\n", fmtdesc.description);
            mpp_log("fmt pixelformat: '%c%c%c%c', description = '%s'\n", fmtdesc.pixelformat & 0xFF,
                    (fmtdesc.pixelformat >> 8) & 0xFF, (fmtdesc.pixelformat >> 16) & 0xFF,
                    (fmtdesc.pixelformat >> 24) & 0xFF, fmtdesc.description);
            fmtdesc.index++;
        }
    }

    if (MPP_FRAME_FMT_IS_YUV(format)) {
        vfmt.fmt.pix.pixelformat = V4L2_yuv_cfg[format - MPP_FRAME_FMT_YUV];
    } else if (MPP_FRAME_FMT_IS_RGB(format)) {
        vfmt.fmt.pix.pixelformat = V4L2_RGB_cfg[format - MPP_FRAME_FMT_RGB];
    }

    if (!vfmt.fmt.pix.pixelformat)
        vfmt.fmt.pix.pixelformat = V4L2_PIX_FMT_NV12;

    type = vfmt.type;
    ctx->type = vfmt.type;

    if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_S_FMT, &vfmt)) {
        mpp_err_f("VIDIOC_S_FMT\n");
        goto FAIL;
    }

    if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_G_FMT, &vfmt)) {
        mpp_err_f("VIDIOC_G_FMT\n");
        goto FAIL;
    }

    mpp_log("get width %d height %d", vfmt.fmt.pix.width, vfmt.fmt.pix.height);

    // Request memory-mapped buffers
    req = (struct v4l2_requestbuffers) {0};
    req.count  = ctx->bufcnt;
    req.type   = type;
    req.memory = V4L2_MEMORY_MMAP;
    if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_REQBUFS, &req)) {
        mpp_err_f("Device does not support mmap\n");
        goto FAIL;
    }

    if (req.count != ctx->bufcnt) {
        mpp_err_f("Device buffer count mismatch\n");
        goto FAIL;
    }

    // mmap() the buffers into userspace memory
    for (i = 0 ; i < ctx->bufcnt; i++) {
        buf = (struct v4l2_buffer) {0};
        buf.type    = type;
        buf.memory  = V4L2_MEMORY_MMAP;
        buf.index   = i;
        struct v4l2_plane planes[FMT_NUM_PLANES];
        buf.memory = V4L2_MEMORY_MMAP;
        if (V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE == type) {
            buf.m.planes = planes;
            buf.length = FMT_NUM_PLANES;
        }

        if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_QUERYBUF, &buf)) {
            mpp_err_f("ERROR: VIDIOC_QUERYBUF\n");
            goto FAIL;
        }

        if (V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE == buf.type) {
            // tmp_buffers[n_buffers].length = buf.m.planes[0].length;
            buf_len = buf.m.planes[0].length;
            ctx->fbuf[i].start =
                mmap(NULL /* start anywhere */,
                     buf.m.planes[0].length,
                     PROT_READ | PROT_WRITE /* required */,
                     MAP_SHARED /* recommended */,
                     ctx->fd, buf.m.planes[0].m.mem_offset);
        } else {
            buf_len = buf.length;
            ctx->fbuf[i].start =
                mmap(NULL /* start anywhere */,
                     buf.length,
                     PROT_READ | PROT_WRITE /* required */,
                     MAP_SHARED /* recommended */,
                     ctx->fd, buf.m.offset);
        }
        if (MAP_FAILED == ctx->fbuf[i].start) {
            mpp_err_f("ERROR: Failed to map device frame buffers\n");
            goto FAIL;
        }

        ctx->fbuf[i].length = buf_len; // record buffer length for unmap

        struct v4l2_exportbuffer expbuf = (struct v4l2_exportbuffer) {0} ;
        // xcam_mem_clear (expbuf);
        expbuf.type = type;
        expbuf.index = i;
        expbuf.flags = O_CLOEXEC;
        if (camera_source_ioctl(ctx->fd, VIDIOC_EXPBUF, &expbuf) < 0) {
            mpp_err_f("get dma buf failed\n");
            goto FAIL;
        } else {
            mpp_log("get dma buf(%d)-fd: %d\n", i, expbuf.fd);
            MppBufferInfo info;
            memset(&info, 0, sizeof(MppBufferInfo));
            info.type = MPP_BUFFER_TYPE_EXT_DMA;
            info.fd =  expbuf.fd;
            info.size = buf_len & 0x07ffffff;
            info.index = (buf_len & 0xf8000000) >> 27;
            mpp_buffer_import(&ctx->fbuf[i].buffer, &info);
        }
        ctx->fbuf[i].export_fd = expbuf.fd;
    }

    for (i = 0; i < ctx->bufcnt; i++ ) {
        struct v4l2_plane planes[FMT_NUM_PLANES];

        buf = (struct v4l2_buffer) {0};
        buf.type    = type;
        buf.memory  = V4L2_MEMORY_MMAP;
        buf.index   = i;
        buf.memory = V4L2_MEMORY_MMAP;

        if (V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE == type) {
            buf.m.planes = planes;
            buf.length = FMT_NUM_PLANES;
        }

        if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_QBUF, &buf)) {
            mpp_err_f("ERROR: VIDIOC_QBUF %d\n", i);
            goto FAIL;
        }
    }

    // Start capturing
    if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_STREAMON, &type)) {
        mpp_err_f("ERROR: VIDIOC_STREAMON\n");
        goto FAIL;
    }

    //skip some frames at start
    for (i = 0; i < ctx->bufcnt; i++ ) {
        RK_S32 idx = camera_source_get_frame(ctx);
        if (idx >= 0)
            camera_source_put_frame(ctx, idx);
    }

    return ctx;

FAIL:
    camera_source_deinit(ctx);
    return NULL;
}